

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcSC3DMCEncodeParams.h
# Opt level: O0

void __thiscall o3dgc::SC3DMCEncodeParams::SC3DMCEncodeParams(SC3DMCEncodeParams *this)

{
  ulong local_20;
  unsigned_long a_1;
  unsigned_long a;
  SC3DMCEncodeParams *this_local;
  
  memset(this,0,0x1030);
  this->m_encodeMode = O3DGC_SC3DMC_ENCODE_MODE_TFAN;
  this->m_streamTypeMode = O3DGC_STREAM_TYPE_ASCII;
  this->m_coordQuantBits = 0xe;
  this->m_normalQuantBits = 8;
  this->m_coordPredMode = O3DGC_SC3DMC_PARALLELOGRAM_PREDICTION;
  this->m_normalPredMode = O3DGC_SC3DMC_SURF_NORMALS_PREDICTION;
  for (a_1 = 0; a_1 < 0x100; a_1 = a_1 + 1) {
    this->m_floatAttributePredMode[a_1] = O3DGC_SC3DMC_DIFFERENTIAL_PREDICTION;
  }
  for (local_20 = 0; local_20 < 0x100; local_20 = local_20 + 1) {
    this->m_intAttributePredMode[local_20] = O3DGC_SC3DMC_NO_PREDICTION;
  }
  return;
}

Assistant:

SC3DMCEncodeParams(void)
                                    {
                                        memset(this, 0, sizeof(SC3DMCEncodeParams));
                                        m_encodeMode        = O3DGC_SC3DMC_ENCODE_MODE_TFAN;
                                        m_streamTypeMode    = O3DGC_STREAM_TYPE_ASCII;
                                        m_coordQuantBits    = 14;
                                        m_normalQuantBits   = 8;
                                        m_coordPredMode     = O3DGC_SC3DMC_PARALLELOGRAM_PREDICTION;
                                        m_normalPredMode    = O3DGC_SC3DMC_SURF_NORMALS_PREDICTION;
                                        for(unsigned long a = 0; a < O3DGC_SC3DMC_MAX_NUM_FLOAT_ATTRIBUTES; ++a)
                                        {
                                            m_floatAttributePredMode[a] = O3DGC_SC3DMC_DIFFERENTIAL_PREDICTION;
                                        }
                                        for(unsigned long a = 0; a < O3DGC_SC3DMC_MAX_NUM_INT_ATTRIBUTES; ++a)
                                        {
                                            m_intAttributePredMode[a] = O3DGC_SC3DMC_NO_PREDICTION;
                                        }
                                    }